

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::contextMenuEvent
          (QWidgetTextControlPrivate *this,QPoint *screenPos,QPointF *docPos,QWidget *contextWidget)

{
  QMenu *this_00;
  QPoint *p;
  QWidget *atAction;
  QWindow *pQVar1;
  QWidgetPrivate *this_01;
  QWidgetTextControlPrivate *in_RDI;
  bool in_stack_00000013;
  WidgetAttribute in_stack_00000014;
  QWindow *window;
  QWidget *widget;
  QMenu *menu;
  QWidgetTextControl *q;
  QWidget *in_stack_00000140;
  QPointF *in_stack_00000148;
  QWidgetTextControl *in_stack_00000150;
  QScreen *in_stack_ffffffffffffffa8;
  QWidget *in_stack_ffffffffffffffb0;
  QWidget *in_stack_ffffffffffffffc0;
  
  this_00 = (QMenu *)q_func(in_RDI);
  p = (QPoint *)
      QWidgetTextControl::createStandardContextMenu
                (in_stack_00000150,in_stack_00000148,in_stack_00000140);
  if (p != (QPoint *)0x0) {
    QWidget::setAttribute((QWidget *)window,in_stack_00000014,in_stack_00000013);
    atAction = qobject_cast<QWidget*>((QObject *)in_stack_ffffffffffffffa8);
    if (atAction != (QWidget *)0x0) {
      QWidget::window(in_stack_ffffffffffffffc0);
      pQVar1 = QWidget::windowHandle(in_stack_ffffffffffffffb0);
      if (pQVar1 != (QWindow *)0x0) {
        this_01 = (QWidgetPrivate *)QWindow::screen();
        QMenuPrivate::get((QMenu *)0x7181ad);
        QWidgetPrivate::topData(this_01);
        QPointer<QScreen>::operator=((QPointer<QScreen> *)this_01,in_stack_ffffffffffffffa8);
      }
    }
    QMenu::popup(this_00,p,(QAction *)atAction);
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::contextMenuEvent(const QPoint &screenPos, const QPointF &docPos, QWidget *contextWidget)
{
#ifdef QT_NO_CONTEXTMENU
    Q_UNUSED(screenPos);
    Q_UNUSED(docPos);
    Q_UNUSED(contextWidget);
#else
    Q_Q(QWidgetTextControl);
    QMenu *menu = q->createStandardContextMenu(docPos, contextWidget);
    if (!menu)
        return;
    menu->setAttribute(Qt::WA_DeleteOnClose);

    if (auto *widget = qobject_cast<QWidget *>(parent)) {
        if (auto *window = widget->window()->windowHandle())
            QMenuPrivate::get(menu)->topData()->initialScreen = window->screen();
    }

    menu->popup(screenPos);
#endif
}